

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

void __thiscall
TPZHybridizeHDiv::InsertPeriferalMaterialObjects
          (TPZHybridizeHDiv *this,TPZVec<TPZCompMesh_*> *meshvec_Hybrid)

{
  int iVar1;
  ostream *this_00;
  TPZCompMesh **ppTVar2;
  TPZMaterial *pTVar3;
  TPZNullMaterial<double> *pTVar4;
  TPZNullMaterial<double> *this_01;
  TPZVec<TPZCompMesh_*> *in_RSI;
  int *in_RDI;
  TPZNullMaterial<double> *matPerif_2;
  TPZCompMesh *fluxmesh;
  TPZNullMaterial<double> *matPerif_1;
  TPZNullMaterial<double> *matPerif;
  int dim;
  TPZCompMesh *pressuremesh;
  size_t in_stack_000003a8;
  char *in_stack_000003b0;
  TPZCompMesh *in_stack_ffffffffffffffb0;
  TPZCompMesh *in_stack_ffffffffffffffb8;
  TPZCompMesh *this_02;
  TPZNullMaterial<double> *in_stack_ffffffffffffffc0;
  
  if ((in_RDI[1] == 0) || (*in_RDI == 0)) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
  }
  ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](in_RSI,1);
  iVar1 = TPZCompMesh::Dimension(*ppTVar2);
  pTVar3 = TPZCompMesh::FindMaterial(in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
  if (pTVar3 == (TPZMaterial *)0x0) {
    pTVar4 = (TPZNullMaterial<double> *)operator_new(0x50);
    TPZNullMaterial<double>::TPZNullMaterial
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    TPZNullMaterial<double>::SetDimension(pTVar4,iVar1 + -1);
    TPZNullMaterial<double>::SetNStateVariables(pTVar4,in_RDI[5]);
    TPZCompMesh::InsertMaterialObject
              (in_stack_ffffffffffffffb8,(TPZMaterial *)in_stack_ffffffffffffffb0);
  }
  pTVar3 = TPZCompMesh::FindMaterial(in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
  pTVar4 = in_stack_ffffffffffffffc0;
  if (pTVar3 == (TPZMaterial *)0x0) {
    pTVar4 = (TPZNullMaterial<double> *)operator_new(0x50);
    TPZNullMaterial<double>::TPZNullMaterial
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    TPZNullMaterial<double>::SetDimension(pTVar4,iVar1 + -1);
    TPZNullMaterial<double>::SetNStateVariables(pTVar4,in_RDI[5]);
    TPZCompMesh::InsertMaterialObject
              (in_stack_ffffffffffffffb8,(TPZMaterial *)in_stack_ffffffffffffffb0);
  }
  ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](in_RSI,0);
  if (*ppTVar2 != (TPZCompMesh *)0x0) {
    ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](in_RSI,0);
    this_02 = *ppTVar2;
    pTVar3 = TPZCompMesh::FindMaterial(in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
    if (pTVar3 == (TPZMaterial *)0x0) {
      this_01 = (TPZNullMaterial<double> *)operator_new(0x50);
      TPZNullMaterial<double>::TPZNullMaterial(pTVar4,(int)((ulong)this_02 >> 0x20));
      TPZNullMaterial<double>::SetDimension(this_01,iVar1 + -1);
      TPZNullMaterial<double>::SetNStateVariables(this_01,in_RDI[5]);
      TPZCompMesh::InsertMaterialObject(this_02,(TPZMaterial *)this_01);
    }
  }
  return;
}

Assistant:

void TPZHybridizeHDiv::InsertPeriferalMaterialObjects(TPZVec<TPZCompMesh *> &meshvec_Hybrid) {
    if (fLagrangeInterface == 0 || fHDivWrapMatid == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }


    TPZCompMesh *pressuremesh = meshvec_Hybrid[1];
    int dim = pressuremesh->Dimension();
    
    if (!pressuremesh->FindMaterial(fLagrangeInterface)) {
        auto matPerif = new TPZNullMaterial(fLagrangeInterface);
        matPerif->SetDimension(dim-1);
        matPerif->SetNStateVariables(fNState);
        pressuremesh->InsertMaterialObject(matPerif);
    }
    if (!pressuremesh->FindMaterial(fLagrangeInterfaceEnd)) {
        auto matPerif = new TPZNullMaterial(fLagrangeInterfaceEnd);
        matPerif->SetDimension(dim-1);
        matPerif->SetNStateVariables(fNState);
        pressuremesh->InsertMaterialObject(matPerif);
    }
    
    if(meshvec_Hybrid[0]!=NULL){

        TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
        if (!fluxmesh->FindMaterial(fHDivWrapMatid)) {
            auto matPerif = new TPZNullMaterial(fHDivWrapMatid);
            matPerif->SetDimension(dim-1);
            matPerif->SetNStateVariables(fNState);
            fluxmesh->InsertMaterialObject(matPerif);
        }
    }
}